

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundedQueue.h
# Opt level: O2

void __thiscall
Glucose::bqueue<unsigned_int>::copyTo(bqueue<unsigned_int> *this,bqueue<unsigned_int> *dest)

{
  double dVar1;
  int iVar2;
  
  dest->last = this->last;
  dest->sumofqueue = this->sumofqueue;
  iVar2 = this->queuesize;
  dest->maxsize = this->maxsize;
  dest->queuesize = iVar2;
  dest->expComputed = this->expComputed;
  dVar1 = this->value;
  dest->exp = this->exp;
  dest->value = dVar1;
  dest->first = this->first;
  vec<unsigned_int>::copyTo(&this->elems,&dest->elems);
  return;
}

Assistant:

void copyTo(bqueue &dest) const {
        dest.last = last;
        dest.sumofqueue = sumofqueue;
        dest.maxsize = maxsize;
        dest.queuesize = queuesize;
        dest.expComputed = expComputed;
        dest.exp = exp;
        dest.value = value;
        dest.first = first;        
        elems.copyTo(dest.elems);
    }